

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_const_element_matrix_provider.cc
# Opt level: O3

MatrixXd * __thiscall
projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider::Eval
          (MatrixXd *__return_storage_ptr__,PiecewiseConstElementMatrixProvider *this,Entity *entity
          )

{
  Index rows;
  Index cols;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 lhs;
  undefined8 rhs;
  PiecewiseConstElementMatrixProvider *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  MatrixXd *pMVar7;
  ulong uVar8;
  undefined4 extraout_var_00;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  Geometry *geo;
  undefined4 extraout_var_01;
  double *pdVar11;
  assign_op<double,_double> *paVar12;
  ulong uVar13;
  double **ppdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  long lVar18;
  RhsNested pMVar19;
  double dVar20;
  double **ppdVar21;
  Index row_1;
  double __tmp;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  MatrixXd *elem_mat;
  FeLagrangeO1Tria<double> hat_func;
  MatrixXd J_inv_trans;
  MatrixXd ref_grads;
  Vector2d t;
  MatrixXd vertices;
  Matrix<double,_2,_3,_0,_2,_3> grads;
  Matrix<double,_2,_3,_0,_2,_3> basis_funct;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  undefined1 local_218 [32];
  variable_if_dynamic<long,__1> vStack_1f8;
  variable_if_dynamic<long,__1> vStack_1f0;
  Matrix<double,__1,__1,_0,__1,__1> *local_1e8;
  double local_1d8;
  undefined8 uStack_1d0;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_1c8;
  undefined1 local_188 [16];
  scalar_constant_op<double> local_178;
  Matrix<double,__1,__1,_0,__1,__1> *local_170;
  Scalar *local_150;
  double local_148;
  long local_140;
  PiecewiseConstElementMatrixProvider *local_138;
  FeLagrangeO1Tria<double> local_130;
  Lhs local_128;
  Rhs local_110;
  Matrix<double,__1,__1,_0,__1,__1> local_f8;
  void *local_e0 [3];
  PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_c8;
  Matrix<double,_2,_3,_0,_2,_3> local_98;
  Matrix<double,_2,_3,_0,_2,_3> local_68;
  long *plVar6;
  
  iVar5 = (*entity->_vptr_Entity[3])(entity);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*entity->_vptr_Entity[4])(entity);
  local_218[0] = (char)iVar5;
  pMVar7 = lf::base::RefEl::NodeCoords((RefEl *)local_218);
  (**(code **)(*plVar6 + 0x18))(local_e0,plVar6,pMVar7);
  ipdg_stokes::mesh::computeOutwardNormals(&local_68,entity);
  local_130.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
       (ScalarReferenceFiniteElement<double>)&PTR__ScalarReferenceFiniteElement_003ec270;
  local_188._0_8_ = 2;
  local_178.m_other = 0.0;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>._0_16_ =
       (MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>,_0>)0x0;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1c8,2,1);
  local_1d8 = local_178.m_other;
  uStack_1d0 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_1c8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_188,(assign_op<double,_double> *)&local_98);
  lVar15 = local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_cols.m_value *
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value;
  uVar8 = lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar15) {
    lVar18 = 0;
    do {
      pdVar11 = (double *)
                ((long)local_1c8.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                       .m_data + lVar18 * 8);
      *pdVar11 = local_1d8;
      pdVar11[1] = local_1d8;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar8);
  }
  auVar3 = _DAT_00359090;
  auVar2 = _DAT_00359080;
  lVar18 = lVar15 % 2;
  if (lVar18 != 0 && (long)uVar8 <= lVar15) {
    lVar16 = lVar18 + -1;
    auVar22._8_4_ = (int)lVar16;
    auVar22._0_8_ = lVar16;
    auVar22._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pdVar11 = (double *)
              ((long)local_1c8.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_data + (lVar15 / 2) * 0x10);
    uVar8 = 0;
    auVar22 = auVar22 ^ _DAT_00359090;
    do {
      auVar25._8_4_ = (int)uVar8;
      auVar25._0_8_ = uVar8;
      auVar25._12_4_ = (int)(uVar8 >> 0x20);
      auVar25 = (auVar25 | auVar2) ^ auVar3;
      bVar1 = auVar22._0_4_ < auVar25._0_4_;
      iVar5 = auVar22._4_4_;
      iVar28 = auVar25._4_4_;
      if ((bool)(~(iVar5 < iVar28 || iVar28 == iVar5 && bVar1) & 1)) {
        pdVar11[uVar8] = local_1d8;
      }
      if (iVar5 >= iVar28 && (iVar28 != iVar5 || !bVar1)) {
        pdVar11[uVar8 + 1] = local_1d8;
      }
      uVar8 = uVar8 + 2;
    } while ((lVar18 + 1U & 0xfffffffffffffffe) != uVar8);
  }
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_218,&local_130,(MatrixXd *)&local_1c8);
  local_c8.m_storage.m_data.array[0] = (double)local_218;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_c8);
  free((void *)local_218._0_8_);
  free(local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data);
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)0x2;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  local_218._0_8_ = (LhsNested)0x0;
  local_218._8_8_ = (RhsNested)0x0;
  local_218._16_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_218,2,1);
  local_1d8 = (double)local_1c8.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value;
  uStack_1d0 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_218,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_1c8,(assign_op<double,_double> *)local_188);
  lVar15 = local_218._16_8_ * local_218._8_8_;
  uVar8 = lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar15) {
    lVar18 = 0;
    do {
      pSVar10 = (Scalar *)(local_218._0_8_ + lVar18 * 8);
      *pSVar10 = local_1d8;
      pSVar10[1] = local_1d8;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar8);
  }
  auVar3 = _DAT_00359090;
  auVar2 = _DAT_00359080;
  lVar18 = lVar15 % 2;
  if (lVar18 != 0 && (long)uVar8 <= lVar15) {
    lVar16 = lVar18 + -1;
    auVar23._8_4_ = (int)lVar16;
    auVar23._0_8_ = lVar16;
    auVar23._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pdVar11 = (double *)(local_218._0_8_ + (lVar15 / 2) * 0x10);
    uVar8 = 0;
    auVar23 = auVar23 ^ _DAT_00359090;
    do {
      auVar26._8_4_ = (int)uVar8;
      auVar26._0_8_ = uVar8;
      auVar26._12_4_ = (int)(uVar8 >> 0x20);
      auVar22 = (auVar26 | auVar2) ^ auVar3;
      bVar1 = auVar23._0_4_ < auVar22._0_4_;
      iVar5 = auVar23._4_4_;
      iVar28 = auVar22._4_4_;
      if ((bool)(~(iVar5 < iVar28 || iVar28 == iVar5 && bVar1) & 1)) {
        pdVar11[uVar8] = local_1d8;
      }
      if (iVar5 >= iVar28 && (iVar28 != iVar5 || !bVar1)) {
        pdVar11[uVar8 + 1] = local_1d8;
      }
      uVar8 = uVar8 + 2;
    } while ((lVar18 + 1U & 0xfffffffffffffffe) != uVar8);
  }
  (**(code **)(*plVar6 + 0x28))(&local_128,plVar6,local_218);
  free((void *)local_218._0_8_);
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_218,&local_128,&local_110);
  lhs = local_218._0_8_;
  rhs = local_218._8_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::resize
            (&local_c8,*(Index *)(local_218._0_8_ + 8),*(Index *)(local_218._8_8_ + 0x10));
  rows = *(Index *)(lhs + 8);
  cols = *(Index *)(rhs + 0x10);
  if (cols != 3 || rows != 2) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::resize(&local_c8,rows,cols);
  }
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,2,3,0,2,3>>
            ((Matrix<double,_2,_3,_0,_2,_3> *)&local_c8,(Matrix<double,__1,__1,_0,__1,__1> *)lhs,
             (Matrix<double,__1,__1,_0,__1,__1> *)rhs);
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 1;
  local_188._8_8_ = (double *)0x0;
  local_178.m_other = 1.48219693752374e-323;
  local_170 = (Matrix<double,__1,__1,_0,__1,__1> *)0x1;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_c8;
  local_188._0_8_ = (assign_op<double,_double> *)&local_98;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       local_c8.m_storage.m_data.array + 1;
  Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false> *)local_218,&local_98,0,0,1
             ,3);
  pdVar11 = local_1c8.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_data;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,1,3,false>,double,double>
            ((Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false> *)local_218,
             (Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false> *)&local_1c8,
             (assign_op<double,_double> *)&local_150);
  if (0 < (long)local_218._16_8_) {
    dVar17 = 0.0;
    do {
      if (0 < (long)local_218._8_8_) {
        pMVar19 = (RhsNested)0x0;
        do {
          *(double *)(local_218._0_8_ + pMVar19 * 8) = pdVar11[(long)pMVar19];
          pMVar19 = (RhsNested)
                    ((long)&(pMVar19->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + 1);
        } while ((RhsNested)local_218._8_8_ != pMVar19);
      }
      dVar17 = (double)((long)dVar17 + 1);
      pdVar11 = pdVar11 + 2;
      local_218._0_8_ = local_218._0_8_ + 0x10;
    } while (dVar17 != (double)local_218._16_8_);
  }
  stack0xfffffffffffffe00 = (undefined1  [16])0x0;
  vStack_1f0.m_value = 1;
  local_218._16_8_ = &local_c8;
  local_218._0_8_ = &local_c8;
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)local_188,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>_>
              *)local_218);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_188);
  local_218._0_8_ = (LhsNested)0x6;
  local_218._8_8_ = (RhsNested)0x6;
  local_218._16_8_ = (PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,6,6);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            (__return_storage_ptr__,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_218,(assign_op<double,_double> *)&local_1c8);
  auVar3 = _DAT_00359090;
  auVar2 = _DAT_00359080;
  lVar15 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_rows *
           (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_cols;
  if (0 < lVar15) {
    pdVar11 = (__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    uVar8 = lVar15 + 0x1fffffffffffffff;
    uVar13 = uVar8 & 0x1fffffffffffffff;
    auVar24._8_4_ = (int)uVar13;
    auVar24._0_8_ = uVar13;
    auVar24._12_4_ = (int)(uVar13 >> 0x20);
    lVar15 = 0;
    auVar24 = auVar24 ^ _DAT_00359090;
    do {
      auVar27._8_4_ = (int)lVar15;
      auVar27._0_8_ = lVar15;
      auVar27._12_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar22 = (auVar27 | auVar2) ^ auVar3;
      if ((bool)(~(auVar22._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar22._0_4_ ||
                  auVar24._4_4_ < auVar22._4_4_) & 1)) {
        pdVar11[lVar15] = (double)local_218._16_8_;
      }
      if ((auVar22._12_4_ != auVar24._12_4_ || auVar22._8_4_ <= auVar24._8_4_) &&
          auVar22._12_4_ <= auVar24._12_4_) {
        pdVar11[lVar15 + 1] = (double)local_218._16_8_;
      }
      lVar15 = lVar15 + 2;
    } while ((uVar13 - ((uint)uVar8 & 1)) + 2 != lVar15);
  }
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_218,
             __return_storage_ptr__,0,0,3,3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1c8.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_rows.m_value;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>._0_16_ =
       auVar2 << 0x40;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              local_218,(Scalar *)&local_1c8);
  local_138 = this;
  iVar5 = (*entity->_vptr_Entity[1])(entity,1);
  local_140 = CONCAT44(extraout_var_00,iVar5);
  lVar15 = 0;
  do {
    lVar18 = 0;
    do {
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)&local_68,1,
                          lVar18);
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)((ulong)*pdVar9 ^ (ulong)DAT_00359110);
      local_218._8_8_ = 0;
      local_218._0_8_ = &local_f8;
      local_218._16_8_ = 4.94065645841247e-324;
      local_218._24_8_ = 1;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)&local_68,0,
                          lVar18);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_218,pdVar9);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_218);
      Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true> *)&local_1c8,&local_98,
                 lVar15);
      vStack_1f0.m_value =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_startCol.m_value;
      local_218._16_8_ =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_cols.m_value;
      vStack_1f8.m_value =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_startRow.m_value;
      local_218._24_8_ =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_xpr;
      local_218._0_8_ =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data;
      local_218._8_8_ =
           local_1c8.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value;
      local_150 = &local_148;
      local_1e8 = &local_f8;
      Eigen::internal::block_evaluator<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>::
      block_evaluator((block_evaluator<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true> *)
                      (local_188 + 8),(XprType *)local_218);
      local_170 = local_1e8;
      local_148 = *(double *)(local_188._8_8_ + 8) *
                  (double)(local_1e8->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_rows +
                  *(double *)local_188._8_8_ *
                  (double)(local_1e8->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data;
      local_1d8 = *local_150;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           __return_storage_ptr__,lVar18 + 3,lVar15);
      *pSVar10 = local_1d8;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_1c8,__return_storage_ptr__,3,0,3,3);
  local_1e8 = (Matrix<double,__1,__1,_0,__1,__1> *)
              local_1c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride;
  vStack_1f0.m_value =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_startCol.m_value;
  local_218._16_8_ =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_cols.m_value;
  vStack_1f8.m_value =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_startRow.m_value;
  local_218._24_8_ =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr;
  local_218._0_8_ =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data;
  local_218._8_8_ =
       local_1c8.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_rows.m_value;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_188,
             __return_storage_ptr__,0,3,3,3);
  pPVar4 = local_138;
  if ((1 < (long)local_188._8_8_) && (1 < (long)local_178.m_other)) {
    Eigen::internal::
    checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_true>
    ::run((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_188,
          (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
          local_218);
  }
  ppdVar14 = (double **)local_218._0_8_;
  dVar17 = (((PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_218._24_8_)->m_storage)
           .m_data.array[1];
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_188,
             (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             local_218,(assign_op<double,_double> *)&local_150);
  lVar15 = local_140;
  if (0 < (long)local_178.m_other) {
    lVar18 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_rows;
    dVar20 = 0.0;
    paVar12 = (assign_op<double,_double> *)local_188._0_8_;
    do {
      if (0 < (long)local_188._8_8_) {
        pdVar11 = (double *)0x0;
        ppdVar21 = ppdVar14;
        do {
          *(double **)(paVar12 + (long)pdVar11 * 8) = *ppdVar21;
          pdVar11 = (double *)((long)pdVar11 + 1);
          ppdVar21 = ppdVar21 + (long)dVar17;
        } while ((double *)local_188._8_8_ != pdVar11);
      }
      dVar20 = (double)((long)dVar20 + 1);
      ppdVar14 = ppdVar14 + 1;
      paVar12 = paVar12 + lVar18 * 8;
    } while (dVar20 != local_178.m_other);
  }
  lVar18 = 3;
  do {
    plVar6 = *(long **)(lVar15 + -0x18 + lVar18 * 8);
    local_1d8 = pPVar4->sigma_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         __return_storage_ptr__,lVar18,lVar18);
    *pSVar10 = -1.0 / local_1d8;
    if (pPVar4->modified_ == true) {
      geo = (Geometry *)(**(code **)(*plVar6 + 0x18))(plVar6);
      local_1d8 = lf::geometry::Volume(geo);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           __return_storage_ptr__,lVar18,lVar18);
      *pSVar10 = *pSVar10 / local_1d8;
    }
    iVar5 = (**pPVar4->boundary_->_vptr_MeshDataSet)(pPVar4->boundary_,plVar6);
    if (*(char *)CONCAT44(extraout_var_01,iVar5) == '\0') {
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           __return_storage_ptr__,lVar18,lVar18);
      *pSVar10 = *pSVar10 * 0.5;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  free(local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_e0[0]);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd PiecewiseConstElementMatrixProvider::Eval(
    const lf::mesh::Entity &entity) const {
  // Get the geometry of the entity
  const auto *geom = entity.Geometry();
  // Compute the global vertex coordinates
  const Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Construct the basis functions from the curl of the standard hat functions
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::Matrix<double, 2, 3> grads = J_inv_trans * ref_grads;
  Eigen::Matrix<double, 2, 3> basis_funct;
  basis_funct << grads.row(1), -grads.row(0);
  // Fill the element matrix
  Eigen::MatrixXd elem_mat = Eigen::MatrixXd::Zero(6, 6);
  // Upper left block
  elem_mat.block(0, 0, 3, 3).setZero();
  // Lower left and upper right blocks
  const auto edges = entity.SubEntities(1);
  for (int basis_func_idx = 0; basis_func_idx < 3; ++basis_func_idx) {
    for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
      Eigen::Vector2d t;
      t << -normals(1, edge_idx), normals(0, edge_idx);
      elem_mat(edge_idx + 3, basis_func_idx) =
          basis_funct.col(basis_func_idx).transpose() * t;
    }
  }
  elem_mat.block(0, 3, 3, 3) = elem_mat.block(3, 0, 3, 3).transpose();
  // Lower right block
  for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
    const auto &edge = *edges[edge_idx];
    elem_mat(edge_idx + 3, edge_idx + 3) = -1 / sigma_;
    if (modified_) {
      elem_mat(edge_idx + 3, edge_idx + 3) /=
          lf::geometry::Volume(*(edge.Geometry()));
    }
    // If the edge is not on the boundary, the entry in the full system matrix
    // will be the sum of two entries of element matrices but we want it still
    // to be equal to 1/sigma. For this reason, we divide the local contribution
    // by 2
    if (!boundary_(edge)) {
      elem_mat(edge_idx + 3, edge_idx + 3) /= 2;
    }
  }
  return elem_mat;
}